

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void mg_if_recv_udp_cb(mg_connection *nc,void *buf,int len,socket_address *sa,size_t sa_len)

{
  mg_add_sock_opts opts_00;
  int iVar1;
  undefined8 local_50;
  mg_add_sock_opts opts;
  mg_connection *lc;
  size_t sa_len_local;
  socket_address *sa_local;
  int len_local;
  void *buf_local;
  mg_connection *nc_local;
  
  if ((nc->flags & 2) != 0) {
    if (LL_DEBUG < s_cs_log_level) {
      fprintf(_stderr,"%-20s ","mg_if_recv_udp_cb");
      cs_log_printf("%p %u",nc,(ulong)(uint)len);
    }
    buf_local = nc;
    if ((nc->flags & 1) != 0) {
      opts.error_string = (char **)nc;
      buf_local = mg_next(nc->mgr,(mg_connection *)0x0);
      while ((buf_local != (void *)0x0 &&
             (iVar1 = memcmp((void *)((long)buf_local + 0x28),sa,sa_len), iVar1 != 0))) {
        buf_local = mg_next((mg_mgr *)opts.error_string[3],(mg_connection *)buf_local);
      }
      if (buf_local == (void *)0x0) {
        memset(&local_50,0,0x18);
        opts_00._8_8_ = opts.user_data;
        opts_00.user_data = (void *)local_50;
        opts_00.error_string = (char **)opts._8_8_;
        buf_local = mg_create_connection
                              ((mg_mgr *)opts.error_string[3],
                               (mg_event_handler_t)opts.error_string[0x14],opts_00);
      }
      if (buf_local == (void *)0x0) {
        if (LL_DEBUG < s_cs_log_level) {
          fprintf(_stderr,"%-20s ","mg_if_recv_udp_cb");
          cs_log_printf("OOM");
        }
      }
      else {
        *(undefined4 *)((long)buf_local + 0x20) = *(undefined4 *)(opts.error_string + 4);
        *(char ***)((long)buf_local + 0x10) = opts.error_string;
        *(undefined8 *)((long)buf_local + 0x28) = *(undefined8 *)sa;
        *(undefined8 *)((long)buf_local + 0x30) = *(undefined8 *)((sa->sa).sa_data + 6);
        *(char **)((long)buf_local + 0x98) = opts.error_string[0x13];
        *(char **)((long)buf_local + 0x90) = opts.error_string[0x12];
        *(char **)((long)buf_local + 0xa8) = opts.error_string[0x15];
        *(char **)((long)buf_local + 0x38) = opts.error_string[7];
        *(undefined8 *)((long)buf_local + 200) = 2;
        mg_add_conn((mg_mgr *)opts.error_string[3],(mg_connection *)buf_local);
        mg_call((mg_connection *)buf_local,(mg_event_handler_t)0x0,1,
                (void *)((long)buf_local + 0x28));
      }
    }
    if (buf_local == (void *)0x0) {
      free(buf);
    }
    else {
      mg_recv_common((mg_connection *)buf_local,buf,len);
    }
    mg_if_recved((mg_connection *)buf_local,(long)len);
    return;
  }
  __assert_fail("nc->flags & MG_F_UDP",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CryptXor[P]jetservd/mongoose.c"
                ,0xa33,
                "void mg_if_recv_udp_cb(struct mg_connection *, void *, int, union socket_address *, size_t)"
               );
}

Assistant:

void mg_if_recv_udp_cb(struct mg_connection *nc, void *buf, int len,
                       union socket_address *sa, size_t sa_len) {
    assert(nc->flags & MG_F_UDP);
    DBG(("%p %u", nc, (unsigned int) len));
    if (nc->flags & MG_F_LISTENING) {
        struct mg_connection *lc = nc;
        /*
     * Do we have an existing connection for this source?
     * This is very inefficient for long connection lists.
     */
        for (nc = mg_next(lc->mgr, NULL); nc != NULL; nc = mg_next(lc->mgr, nc)) {
            if (memcmp(&nc->sa.sa, &sa->sa, sa_len) == 0) break;
        }
        if (nc == NULL) {
            struct mg_add_sock_opts opts;
            memset(&opts, 0, sizeof(opts));
            nc = mg_create_connection(lc->mgr, lc->handler, opts);
        }
        if (nc != NULL) {
            nc->sock = lc->sock;
            nc->listener = lc;
            nc->sa = *sa;
            nc->proto_data = lc->proto_data;
            nc->proto_handler = lc->proto_handler;
            nc->user_data = lc->user_data;
            nc->recv_mbuf_limit = lc->recv_mbuf_limit;
            nc->flags = MG_F_UDP;
            mg_add_conn(lc->mgr, nc);
            mg_call(nc, NULL, MG_EV_ACCEPT, &nc->sa);
        } else {
            DBG(("OOM"));
        }
    }
    if (nc != NULL) {
        mg_recv_common(nc, buf, len);
    } else {
        /* Drop on the floor. */
        MG_FREE(buf);
    }
    mg_if_recved(nc, len);
}